

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,longdouble value,format_specs *spec)

{
  undefined4 uVar1;
  undefined3 uVar2;
  undefined8 uVar3;
  char cVar4;
  bool bVar5;
  int precision;
  alignment aVar6;
  type pcVar7;
  char *local_390;
  char *local_388;
  undefined1 local_379;
  double_writer local_358;
  type local_340;
  type *local_338;
  type *it;
  undefined4 uStack_328;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  size_t size;
  char buf [100];
  char type;
  allocator<char> local_279;
  undefined1 local_278 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler<char> handler;
  format_specs *spec_local;
  longdouble value_local;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  
  _spec_local = value;
  cVar4 = basic_format_specs<char>::type(spec);
  float_spec_handler<char>::float_spec_handler
            ((float_spec_handler<char> *)&write_inf_or_nan.field_0x26,cVar4);
  cVar4 = basic_format_specs<char>::type(spec);
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
            (cVar4,(float_spec_handler<char> *)&write_inf_or_nan.field_0x26);
  write_inf_or_nan._37_1_ = 0;
  bVar5 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnegative((double)value);
  if (bVar5) {
    write_inf_or_nan._37_1_ = 0x2d;
    _spec_local = -value;
  }
  else {
    bVar5 = basic_format_specs<char>::flag(spec,1);
    if (bVar5) {
      bVar5 = basic_format_specs<char>::flag(spec,2);
      local_379 = 0x2b;
      if (!bVar5) {
        local_379 = 0x20;
      }
      write_inf_or_nan._37_1_ = local_379;
    }
  }
  write_inf_or_nan.spec._8_5_ = SUB85((ulong)*(undefined8 *)((long)&spec->flags_ + 1) >> 0x18,0);
  write_inf_or_nan.writer =
       *(basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         **)&spec->super_align_spec;
  uVar3 = *(undefined8 *)&(spec->super_align_spec).align_;
  write_inf_or_nan.spec.super_align_spec._0_5_ = SUB85(uVar3,0);
  write_inf_or_nan.spec.super_align_spec.fill_._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  write_inf_or_nan.spec.precision_._0_1_ = write_inf_or_nan._37_1_;
  buffer._528_8_ = this;
  bVar5 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>(_spec_local);
  if (bVar5) {
    if ((write_inf_or_nan._39_1_ & 1) == 0) {
      local_388 = "nan";
    }
    else {
      local_388 = "NAN";
    }
    write_double<long_double>::write_inf_or_nan_t::operator()
              ((write_inf_or_nan_t *)(buffer.store_ + 0x1f0),local_388);
  }
  else {
    bVar5 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>(_spec_local);
    if (bVar5) {
      if ((write_inf_or_nan._39_1_ & 1) == 0) {
        local_390 = "inf";
      }
      else {
        local_390 = "INF";
      }
      write_double<long_double>::write_inf_or_nan_t::operator()
                ((write_inf_or_nan_t *)(buffer.store_ + 0x1f0),local_390);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_278,&local_279);
      std::allocator<char>::~allocator(&local_279);
      buf[99] = basic_format_specs<char>::type(spec);
      internal::use_grisu();
      bVar5 = internal::const_check<bool>(false);
      cVar4 = buf[99];
      if (((bVar5) && (buf[99] != 'a')) && (buf[99] != 'A')) {
        normalized_spec.precision_ = 0;
        normalized_spec.type_ = '\0';
        normalized_spec._21_3_ = 0;
        precision = basic_format_specs<char>::precision(spec);
        bVar5 = basic_format_specs<char>::flag(spec,8);
        internal::grisu2_format
                  ((double)_spec_local,(char *)&size,(size_t *)&normalized_spec.precision_,cVar4,
                   precision,bVar5);
        if (100 < (ulong)normalized_spec._16_8_) {
          __assert_fail("(size <= 100) && \"buffer overflow\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                        ,0xb52,
                        "void fmt::basic_writer<fmt::output_range<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>::write_double(T, const format_specs &) [Range = fmt::output_range<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>, T = long double]"
                       );
        }
        internal::basic_buffer<char>::append<char>
                  ((basic_buffer<char> *)local_278,(char *)&size,buf + normalized_spec._16_8_ + -8);
      }
      else {
        uVar1 = spec->precision_;
        uVar2 = *(undefined3 *)&spec->field_0x15;
        n._0_4_ = (spec->super_align_spec).width_;
        n._4_4_ = (spec->super_align_spec).fill_;
        normalized_spec.super_align_spec._0_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
        normalized_spec.flags_._0_1_ = write_inf_or_nan._38_1_;
        normalized_spec.super_align_spec.align_ = uVar1;
        normalized_spec.flags_._1_3_ = uVar2;
        write_double_sprintf<long_double>
                  (this,_spec_local,(format_specs *)&n,(basic_buffer<char> *)local_278);
      }
      as._4_8_ = internal::basic_buffer<char>::size((basic_buffer<char> *)local_278);
      it._4_4_ = (spec->super_align_spec).width_;
      uStack_328 = (spec->super_align_spec).fill_;
      as.width_ = (spec->super_align_spec).align_;
      aVar6 = align_spec::align(&spec->super_align_spec);
      if (aVar6 == ALIGN_NUMERIC) {
        if (write_inf_or_nan._37_1_ != '\0') {
          pcVar7 = reserve(this,1);
          local_338 = &local_340;
          local_340 = pcVar7 + 1;
          *pcVar7 = write_inf_or_nan._37_1_;
          write_inf_or_nan._37_1_ = 0;
          if (it._4_4_ != 0) {
            stack0xfffffffffffffcd4 = CONCAT44(uStack_328,it._4_4_ + -1);
          }
        }
        as.width_ = 2;
      }
      else {
        aVar6 = align_spec::align(&spec->super_align_spec);
        if (aVar6 == ALIGN_DEFAULT) {
          as.width_ = 2;
        }
        if (write_inf_or_nan._37_1_ != '\0') {
          as._4_8_ = as._4_8_ + 1;
        }
      }
      local_358.n._0_4_ = as.fill_;
      local_358.n._4_4_ = as.align_;
      local_358.sign = write_inf_or_nan._37_1_;
      local_358.buffer = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_278;
      basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::double_writer>
                ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  *)this,as._4_8_,(align_spec *)((long)&it + 4),&local_358);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_278);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  char type = static_cast<char>(spec.type());
  if (internal::const_check(
        internal::use_grisu() && sizeof(T) <= sizeof(double)) &&
      type != 'a' && type != 'A') {
    char buf[100]; // TODO: correct buffer size
    size_t size = 0;
    internal::grisu2_format(static_cast<double>(value), buf, size, type,
                            spec.precision(), spec.flag(HASH_FLAG));
    FMT_ASSERT(size <= 100, "buffer overflow");
    buffer.append(buf, buf + size); // TODO: avoid extra copy
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}